

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handypack.hpp
# Opt level: O2

void NHandyPack::
     TVectorSerializer<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>::Load
               (istream *in,vector<unsigned_int,_std::allocator<unsigned_int>_> *object)

{
  pointer puVar1;
  size_t i;
  ulong uVar2;
  uint local_30;
  uint local_2c;
  uint obj;
  uint32_t size;
  
  std::istream::read((char *)in,(long)&local_2c);
  puVar1 = (object->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((object->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (object->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(object,(ulong)local_2c);
  for (uVar2 = 0; uVar2 < local_2c; uVar2 = uVar2 + 1) {
    TPodSerializer<unsigned_int>::Load(in,&local_30);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (object,&local_30);
  }
  return;
}

Assistant:

static inline void Load(std::istream& in, TVec& object) {
        uint32_t size;
        in.read((char*)(&size), sizeof(size));
        object.clear();
        object.reserve(size);
        for (size_t i = 0; i < size; ++i) {
            TObj obj;
            NHandyPack::Load(in, obj);
            object.push_back(std::move(obj));
        }
    }